

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::run
          (UniformLocationCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ShaderStage SVar3;
  anon_struct_8_2_bfd9d0cb_for_basic aVar4;
  anon_struct_8_2_bfd9d0cb_for_basic aVar5;
  TestLog *pTVar6;
  RenderContext *context;
  void *pvVar7;
  VarTypeComponent *pVVar8;
  undefined1 auVar9 [4];
  bool bVar10;
  int i;
  DataType DVar11;
  int iVar12;
  int iVar13;
  deUint32 dVar14;
  ChannelOrder CVar15;
  IterateResult extraout_EAX;
  long *plVar16;
  TextureFormat *pTVar17;
  ostream *poVar18;
  char *pcVar19;
  TextureFormat *pTVar20;
  undefined8 *puVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Base_ptr p_Var22;
  undefined4 extraout_var_02;
  pointer pUVar23;
  long lVar24;
  Texture2D *this_00;
  TestError *this_01;
  ChannelOrder CVar25;
  long *plVar26;
  TextureFormat TVar27;
  ulong *puVar28;
  _Base_ptr p_Var29;
  pointer pUVar30;
  ulong uVar31;
  int precision;
  VarType *type;
  VarType *type_00;
  _Base_ptr p_Var32;
  pointer pUVar33;
  SubTypeIterator<glu::IsBasicType> *pSVar34;
  long lVar35;
  uint uVar36;
  undefined8 uVar37;
  TypeComponentVector *pTVar38;
  string *__v;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  _Var39;
  TypeComponentVector *pTVar40;
  int iVar41;
  ulong uVar42;
  UniformLocationCase *pUVar43;
  uint sizedFormat;
  float fVar44;
  float fVar45;
  StructType *structType;
  string uniName;
  Surface rendered;
  string layout;
  RandomViewport viewport;
  VarType subType;
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  declaredStructs;
  deInt32 intBuf [4];
  BasicTypeIterator subTypeIter;
  deUint16 indices [6];
  ostringstream vertMain;
  ostringstream fragMain;
  ostringstream fragDecl;
  ShaderProgram program;
  ProgramSources sources;
  undefined1 local_ac8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab8;
  string local_aa8;
  UniformLocationCase *local_a80;
  _anonymous_namespace_ *local_a78;
  undefined1 local_a70 [32];
  pointer local_a50;
  long local_a48;
  undefined1 local_a40 [8];
  TextureFormat local_a38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a30;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  *local_a20;
  ulong local_a18;
  pointer local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [8];
  undefined8 uStack_9d0;
  undefined1 local_9c8 [24];
  size_t local_9b0;
  VarTypeComponent *local_9a8;
  int local_99c;
  SubTypeIterator<glu::IsBasicType> local_998;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  long *local_958;
  long local_950;
  long local_948;
  long lStack_940;
  undefined1 local_938 [4];
  float fStack_934;
  undefined1 auStack_930 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_910 [4];
  ios_base local_8c8 [8];
  ios_base local_8c0 [272];
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  VarTypeComponent *local_778;
  VarTypeComponent *local_770;
  VarTypeComponent *local_768;
  VarTypeComponent *local_760;
  VarTypeComponent *local_758;
  VarTypeComponent *local_750;
  VarTypeComponent *local_748;
  VarTypeComponent *local_740;
  undefined8 *local_738;
  Texture2D *local_730;
  undefined8 local_728;
  undefined4 local_720;
  long *local_718 [2];
  long local_708 [2];
  undefined1 local_6f8 [12];
  uint uStack_6ec;
  _Base_ptr local_6e8;
  _Base_ptr p_Stack_6e0;
  _Base_ptr local_6d8;
  size_t sStack_6d0;
  undefined1 *local_6c8;
  undefined8 uStack_6c0;
  ios_base local_688 [272];
  undefined1 local_578 [8];
  VarType *pVStack_570;
  Data local_568 [6];
  ios_base local_508 [272];
  undefined1 local_3f8 [8];
  pointer pVStack_3f0;
  Data local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ios_base local_388 [272];
  undefined1 local_278 [112];
  ios_base local_208 [40];
  deUint32 local_1e0;
  bool local_1b8;
  ProgramSources local_100;
  undefined4 extraout_var_03;
  
  local_a20 = uniformList;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
  local_a80 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n",0x4b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"out highp vec4 v_color;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"#version 310 es\n\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,
             "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n",0x4b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"in highp vec4 v_color;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f8,"layout(location = 0) out mediump vec4 o_color;\n\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"void main()\n{\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6f8,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6f8,"\tv_color = vec4(1.0);\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_578,"void main()\n{\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_578,"\to_color = v_color;\n",0x14);
  local_9c8._8_8_ = &uStack_9d0;
  uStack_9d0 = (pointer)((ulong)uStack_9d0._4_4_ << 0x20);
  local_9c8._0_8_ = (_Base_ptr)0x0;
  local_9b0 = 0;
  pUVar23 = (local_a20->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_9c8._16_8_ = local_9c8._8_8_;
  if (0 < (int)((ulong)((long)(local_a20->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar23) >> 3) *
          -0x33333333) {
    lVar35 = 0;
    do {
      pUVar23 = pUVar23 + lVar35;
      local_a78 = (_anonymous_namespace_ *)CONCAT44(local_a78._4_4_,pUVar23->declareLocation);
      local_a50 = (pointer)CONCAT44(local_a50._4_4_,pUVar23->layoutLocation);
      SVar3 = pUVar23->checkLocation;
      iVar12 = pUVar23->location;
      local_a48 = lVar35;
      if (iVar12 < 0) {
        TVar27 = (TextureFormat)&local_a30;
        pTVar20 = &local_a38;
        local_a40 = (undefined1  [8])TVar27;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_938);
        std::ostream::operator<<((ostringstream *)local_938,pUVar23->location);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_938);
        std::ios_base::~ios_base(local_8c8);
        plVar16 = (long *)std::__cxx11::string::replace((ulong)local_718,0,(char *)0x0,0x1b7919f);
        plVar26 = plVar16 + 2;
        if ((long *)*plVar16 == plVar26) {
          local_948 = *plVar26;
          lStack_940 = plVar16[3];
          local_958 = &local_948;
        }
        else {
          local_948 = *plVar26;
          local_958 = (long *)*plVar16;
        }
        local_950 = plVar16[1];
        *plVar16 = (long)plVar26;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        pTVar17 = (TextureFormat *)std::__cxx11::string::append((char *)&local_958);
        local_a40 = (undefined1  [8])&local_a30;
        TVar27 = (TextureFormat)(pTVar17 + 2);
        if (*pTVar17 == TVar27) {
          local_a30._M_allocated_capacity = *(undefined8 *)TVar27;
          local_a30._8_8_ = pTVar17[3];
        }
        else {
          local_a30._M_allocated_capacity = *(undefined8 *)TVar27;
          local_a40 = (undefined1  [8])*pTVar17;
        }
        pTVar20 = pTVar17 + 1;
        local_a38 = pTVar17[1];
        *pTVar17 = TVar27;
      }
      pTVar20->order = R;
      pTVar20->type = SNORM_INT8;
      *(char *)TVar27 = '\0';
      if (-1 < iVar12) {
        if (local_958 != &local_948) {
          operator_delete(local_958,local_948 + 1);
        }
        if (local_718[0] != local_708) {
          operator_delete(local_718[0],local_708[0] + 1);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_938);
      std::ostream::operator<<((ostringstream *)local_938,(int)local_a48);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_938);
      std::ios_base::~ios_base(local_8c8);
      _Var39._M_current = (VarTypeComponent *)0x3;
      plVar16 = (long *)std::__cxx11::string::replace((ulong)local_ac8,0,(char *)0x0,0x1abd6aa);
      local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
      puVar28 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar28) {
        local_aa8.field_2._M_allocated_capacity = *puVar28;
        local_aa8.field_2._8_8_ = plVar16[3];
      }
      else {
        local_aa8.field_2._M_allocated_capacity = *puVar28;
        local_aa8._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_aa8._M_string_length = plVar16[1];
      *plVar16 = (long)puVar28;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ac8._0_8_ != &local_ab8) {
        operator_delete((void *)local_ac8._0_8_,(ulong)(local_ab8._M_allocated_capacity + 1));
      }
      iVar12 = pUVar23->location;
      if ((pUVar23->type).m_type == TYPE_STRUCT) {
        local_ac8._0_8_ = (pUVar23->type).m_data.basic;
        p_Var22 = (_Base_ptr)&uStack_9d0;
        for (p_Var32 = (_Base_ptr)local_9c8._0_8_; p_Var32 != (_Base_ptr)0x0;
            p_Var32 = (&p_Var32->_M_left)[(ulong)aVar4 < (ulong)local_ac8._0_8_]) {
          aVar4.type = p_Var32[1]._M_color;
          aVar4.precision = *(Precision *)&p_Var32[1].field_0x4;
          if ((ulong)aVar4 >= (ulong)local_ac8._0_8_) {
            p_Var22 = p_Var32;
          }
        }
        p_Var32 = (_Base_ptr)&uStack_9d0;
        if ((p_Var22 != (_Base_ptr)&uStack_9d0) &&
           (aVar5.type = p_Var22[1]._M_color, aVar5.precision = *(Precision *)&p_Var22[1].field_0x4,
           p_Var32 = p_Var22, (ulong)local_ac8._0_8_ < (ulong)aVar5)) {
          p_Var32 = (_Base_ptr)&uStack_9d0;
        }
        if (p_Var32 == (_Base_ptr)&uStack_9d0) {
          if (((ulong)local_a78 & 1) != 0) {
            local_938 = SUB84(local_ac8._0_8_,0);
            fStack_934 = SUB84(local_ac8._0_8_,4);
            auStack_930._0_4_ = TYPE_INVALID;
            poVar18 = glu::decl::operator<<((ostream *)local_278,(DeclareStructTypePtr *)local_938);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,";\n",2);
          }
          if (((ulong)local_a78 & 2) != 0) {
            local_938 = SUB84(local_ac8._0_8_,0);
            fStack_934 = SUB84(local_ac8._0_8_,4);
            auStack_930._0_4_ = TYPE_INVALID;
            poVar18 = glu::decl::operator<<((ostream *)local_3f8,(DeclareStructTypePtr *)local_938);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,";\n",2);
          }
          std::
          _Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
          ::_M_insert_unique<glu::StructType_const*const&>
                    ((_Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
                      *)local_9d8,(StructType **)local_ac8);
        }
      }
      if (((ulong)local_a78 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"uniform ",8);
        local_ac8._0_8_ = &local_ab8;
        if (((ulong)local_a50 & 1) == 0) {
          local_ac8._8_4_ = TYPE_INVALID;
          local_ac8._12_4_ = PRECISION_LOWP;
          local_ab8._M_allocated_capacity = local_ab8._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_ac8,local_a40,(pointer)((long)local_a38 + (long)local_a40));
        }
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(char *)local_ac8._0_8_,local_ac8._8_8_);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_938,&pUVar23->type,&local_aa8,0);
        poVar18 = glu::decl::operator<<(poVar18,(DeclareVariable *)local_938);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_930._16_8_ != local_910) {
          operator_delete((void *)auStack_930._16_8_,local_910[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_938);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac8._0_8_ != &local_ab8) {
          operator_delete((void *)local_ac8._0_8_,(ulong)(local_ab8._M_allocated_capacity + 1));
        }
      }
      if (((ulong)local_a78 & 2) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"uniform ",8);
        local_ac8._0_8_ = &local_ab8;
        if (((ulong)local_a50 & 2) == 0) {
          local_ac8._8_4_ = TYPE_INVALID;
          local_ac8._12_4_ = PRECISION_LOWP;
          local_ab8._M_allocated_capacity = local_ab8._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_ac8,local_a40,(pointer)((long)local_a38 + (long)local_a40));
        }
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,(char *)local_ac8._0_8_,local_ac8._8_8_);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_938,&pUVar23->type,&local_aa8,0);
        poVar18 = glu::decl::operator<<(poVar18,(DeclareVariable *)local_938);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_930._16_8_ != local_910) {
          operator_delete((void *)auStack_930._16_8_,local_910[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_938);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac8._0_8_ != &local_ab8) {
          operator_delete((void *)local_ac8._0_8_,(ulong)(local_ab8._M_allocated_capacity + 1));
        }
      }
      glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)local_938,&pUVar23->type);
      iVar41 = iVar12;
      while( true ) {
        local_ab8._M_allocated_capacity = 0;
        local_ab8._8_8_ = (pointer)0x0;
        local_ac8._0_4_ = TYPE_INVALID;
        local_ac8._4_4_ = PRECISION_LOWP;
        local_ac8._8_4_ = TYPE_INVALID;
        local_ac8._12_4_ = PRECISION_LOWP;
        bVar10 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                           ((SubTypeIterator<glu::IsBasicType> *)local_938,
                            (SubTypeIterator<glu::IsBasicType> *)local_ac8);
        if ((anon_struct_8_2_bfd9d0cb_for_basic)local_ac8._8_8_ !=
            (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
          operator_delete((void *)local_ac8._8_8_,local_ab8._8_8_ - local_ac8._8_8_);
        }
        if (!bVar10) break;
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  ((VarType *)local_9f8,(glu *)pUVar23,
                   (VarType *)CONCAT44(auStack_930._4_4_,auStack_930._0_4_),
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )auStack_930._8_8_,_Var39);
        DVar11 = glu::getDataTypeScalarType(local_9f8._8_4_);
        pcVar19 = glu::getDataTypeName(DVar11);
        iVar13 = -1;
        if (-1 < iVar12) {
          iVar13 = iVar41;
        }
        fVar44 = getExpectedValue(DVar11,iVar13,pcVar19);
        de::floatToString_abi_cxx11_((string *)local_ac8,(de *)0x3,fVar44,precision);
        if (DVar11 - TYPE_SAMPLER_1D < 0x1e) {
          if ((SVar3 & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6f8,"\tv_color.rgb *= verify(float( texture(",0x26);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6f8,local_aa8._M_dataplus._M_p,
                                 local_aa8._M_string_length);
            local_a70._8_8_ = auStack_930;
            local_a70._0_8_ = pUVar23;
            poVar18 = glu::operator<<(poVar18,(TypeAccessFormat *)local_a70);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,", vec2(0.5)).r), ",0x11);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,(char *)local_ac8._0_8_,local_ac8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,");\n",3);
          }
          if ((SVar3 & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_578,"\to_color.rgb *= verify(float( texture(",0x26);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_578,local_aa8._M_dataplus._M_p,
                                 local_aa8._M_string_length);
            local_a70._8_8_ = auStack_930;
            local_a70._0_8_ = pUVar23;
            poVar18 = glu::operator<<(poVar18,(TypeAccessFormat *)local_a70);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,", vec2(0.5)).r), ",0x11);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,(char *)local_ac8._0_8_,local_ac8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,");\n",3);
          }
        }
        else {
          if ((SVar3 & SHADERSTAGE_VERTEX) != SHADERSTAGE_NONE) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6f8,"\tv_color.rgb *= verify(float(",0x1d);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6f8,local_aa8._M_dataplus._M_p,
                                 local_aa8._M_string_length);
            local_a00 = (TypeComponentVector *)auStack_930;
            local_a08 = pUVar23;
            poVar18 = glu::operator<<(poVar18,(TypeAccessFormat *)&local_a08);
            Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
                      ((string *)local_a70,(_anonymous_namespace_ *)local_9f8,type);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,(char *)local_a70._0_8_,local_a70._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"), ",3);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,(char *)local_ac8._0_8_,local_ac8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,");\n",3);
            if ((pointer)local_a70._0_8_ != (pointer)(local_a70 + 0x10)) {
              operator_delete((void *)local_a70._0_8_,(ulong)(local_a70._16_8_ + 1));
            }
          }
          if ((SVar3 & SHADERSTAGE_FRAGMENT) != SHADERSTAGE_NONE) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_578,"\to_color.rgb *= verify(float(",0x1d);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_578,local_aa8._M_dataplus._M_p,
                                 local_aa8._M_string_length);
            local_a00 = (TypeComponentVector *)auStack_930;
            local_a08 = pUVar23;
            poVar18 = glu::operator<<(poVar18,(TypeAccessFormat *)&local_a08);
            Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
                      ((string *)local_a70,(_anonymous_namespace_ *)local_9f8,type_00);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,(char *)local_a70._0_8_,local_a70._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"), ",3);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,(char *)local_ac8._0_8_,local_ac8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,");\n",3);
            if ((pointer)local_a70._0_8_ != (pointer)(local_a70 + 0x10)) {
              operator_delete((void *)local_a70._0_8_,(ulong)(local_a70._16_8_ + 1));
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac8._0_8_ != &local_ab8) {
          operator_delete((void *)local_ac8._0_8_,(ulong)(local_ab8._M_allocated_capacity + 1));
        }
        glu::VarType::~VarType((VarType *)local_9f8);
        glu::SubTypeIterator<glu::IsBasicType>::operator++
                  (&local_998,(SubTypeIterator<glu::IsBasicType> *)local_938,0);
        if (local_998.m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_998.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_998.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_998.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar41 = iVar41 + 1;
      }
      pvVar7 = (void *)CONCAT44(auStack_930._4_4_,auStack_930._0_4_);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,auStack_930._16_8_ - (long)pvVar7);
      }
      lVar35 = local_a48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
        operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
      }
      if (local_a40 != (undefined1  [8])&local_a30) {
        operator_delete((void *)local_a40,local_a30._M_allocated_capacity + 1);
      }
      lVar35 = lVar35 + 1;
      pUVar23 = (local_a20->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar35 < (int)((ulong)((long)(local_a20->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pUVar23) >> 3) * -0x33333333);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_578,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  uVar37 = 0xf;
  if (local_a40 != (undefined1  [8])&local_a30) {
    uVar37 = local_a30._M_allocated_capacity;
  }
  if ((ulong)uVar37 < local_aa8._M_string_length + (long)local_a38) {
    uVar37 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
      uVar37 = local_aa8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar37 < local_aa8._M_string_length + (long)local_a38) goto LAB_015537de;
    pTVar20 = (TextureFormat *)
              std::__cxx11::string::replace((ulong)&local_aa8,0,(char *)0x0,(ulong)local_a40);
  }
  else {
LAB_015537de:
    pTVar20 = (TextureFormat *)
              std::__cxx11::string::_M_append(local_a40,(ulong)local_aa8._M_dataplus._M_p);
  }
  _local_938 = (TextureFormat)((long)auStack_930 + 8);
  TVar27 = (TextureFormat)(pTVar20 + 2);
  if (*pTVar20 == TVar27) {
    auStack_930._8_8_ = *(undefined8 *)TVar27;
    auStack_930._16_8_ = pTVar20[3];
  }
  else {
    auStack_930._8_8_ = *(undefined8 *)TVar27;
    _local_938 = *pTVar20;
  }
  auStack_930._0_4_ = pTVar20[1].order;
  auStack_930._4_4_ = pTVar20[1].type;
  *pTVar20 = TVar27;
  pTVar20[1].order = R;
  pTVar20[1].type = SNORM_INT8;
  *(undefined1 *)TVar27 = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  pTVar40 = (TypeComponentVector *)((long)(Type *)local_9f8._8_8_ + local_a70._8_8_);
  pTVar38 = (TypeComponentVector *)0xf;
  if ((pointer)local_a70._0_8_ != (pointer)(local_a70 + 0x10)) {
    pTVar38 = (TypeComponentVector *)local_a70._16_8_;
  }
  if (pTVar38 < pTVar40) {
    pTVar38 = (TypeComponentVector *)0xf;
    if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
      pTVar38 = (TypeComponentVector *)local_9e8._0_8_;
    }
    if (pTVar40 <= pTVar38) {
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_9f8,0,(char *)0x0,local_a70._0_8_);
      goto LAB_015538ec;
    }
  }
  puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_a70,local_9f8._0_8_);
LAB_015538ec:
  local_ac8._0_8_ = &local_ab8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar21 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar21 == paVar1) {
    local_ab8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_ab8._8_8_ = puVar21[3];
  }
  else {
    local_ab8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_ac8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar21;
  }
  local_ac8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(puVar21 + 1);
  *puVar21 = paVar1;
  puVar21[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,(value_type *)local_938);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,(value_type *)local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._0_8_ != &local_ab8) {
    operator_delete((void *)local_ac8._0_8_,(ulong)(local_ab8._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
    operator_delete((void *)local_9f8._0_8_,(ulong)(local_9e8._0_8_ + 1));
  }
  if ((pointer)local_a70._0_8_ != (pointer)(local_a70 + 0x10)) {
    operator_delete((void *)local_a70._0_8_,(ulong)(local_a70._16_8_ + 1));
  }
  if (_local_938 != (TextureFormat)((long)auStack_930 + 8)) {
    operator_delete((void *)_local_938,auStack_930._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if (local_a40 != (undefined1  [8])&local_a30) {
    operator_delete((void *)local_a40,local_a30._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~_Rb_tree((_Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
               *)local_9d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_578);
  std::ios_base::~ios_base(local_508);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
  std::ios_base::~ios_base(local_388);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
  std::ios_base::~ios_base(local_688);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  pUVar43 = local_a80;
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_278,local_a80->m_renderCtx,&local_100);
  iVar12 = tcu::CommandLine::getBaseSeed
                     (((pUVar43->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  iVar41 = (*pUVar43->m_renderCtx->_vptr_RenderContext[3])();
  iVar13 = (*pUVar43->m_renderCtx->_vptr_RenderContext[4])();
  dVar14 = deStringHash((local_a80->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  _Var39._M_current = (VarTypeComponent *)(ulong)(dVar14 + iVar12);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&local_a08,(RenderTarget *)CONCAT44(extraout_var_00,iVar13),0x10,0x10
             ,dVar14 + iVar12);
  tcu::Surface::Surface((Surface *)local_a70,0x10,0x10);
  pUVar43 = local_a80;
  iVar12 = (*local_a80->m_renderCtx->_vptr_RenderContext[3])();
  dVar14 = local_1e0;
  local_a48 = CONCAT44(extraout_var_01,iVar12);
  bVar10 = ((*(Shader **)local_278._0_8_)->m_info).compileOk;
  bVar2 = ((*(Shader **)local_278._24_8_)->m_info).compileOk;
  local_a10 = (pointer)((pUVar43->super_TestCase).super_TestNode.m_testCtx)->m_log;
  stack0xfffffffffffff910 = (ulong)uStack_6ec << 0x20;
  local_6e8 = (_Base_ptr)0x0;
  p_Stack_6e0 = (_Base_ptr)(local_6f8 + 8);
  sStack_6d0 = 0;
  local_6d8 = p_Stack_6e0;
  glu::operator<<((TestLog *)local_a10,(ShaderProgram *)local_278);
  if (((bVar10 == false) || (bVar2 == false)) || (local_1b8 == false)) {
    local_938 = SUB84(local_a10,0);
    fStack_934 = (float)((ulong)local_a10 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_930);
    pUVar43 = local_a80;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_930,"ERROR: shader failed to compile/link",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_938,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_930);
    std::ios_base::~ios_base(local_8c0);
    tcu::TestContext::setTestResult
              ((pUVar43->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader failed to compile/link");
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_6f8);
  }
  else {
    pUVar23 = (local_a20->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar12 = (int)((ulong)((long)(local_a20->
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar23) >> 3)
             * -0x33333333;
    local_a18 = (ulong)CONCAT31((int3)((uint)iVar12 >> 8),iVar12 < 1);
    local_9a8 = (VarTypeComponent *)CONCAT44(extraout_var,iVar41);
    if (0 < iVar12) {
      local_a78 = (_anonymous_namespace_ *)0x0;
      local_a18 = 0;
      TVar27 = _local_938;
      do {
        pUVar23 = pUVar23 + (long)local_a78;
        _local_938 = TVar27;
        glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                  ((SubTypeIterator<glu::IsBasicType> *)local_3f8,&pUVar23->type);
        iVar12 = 0;
        local_a50 = pUVar23;
        while( true ) {
          auStack_930._8_8_ = 0;
          auStack_930._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_938 = (undefined1  [4])0x0;
          fStack_934 = 0.0;
          auStack_930._0_4_ = TYPE_INVALID;
          auStack_930._4_4_ = PRECISION_LOWP;
          bVar10 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                             ((SubTypeIterator<glu::IsBasicType> *)local_3f8,
                              (SubTypeIterator<glu::IsBasicType> *)local_938);
          pvVar7 = (void *)CONCAT44(auStack_930._4_4_,auStack_930._0_4_);
          if (pvVar7 != (void *)0x0) {
            operator_delete(pvVar7,auStack_930._16_8_ - (long)pvVar7);
          }
          if (!bVar10) break;
          Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                    ((string *)local_578,local_a78,(int)pUVar23,(VarType *)&pVStack_3f0,
                     (TypeComponentVector *)_Var39._M_current);
          CVar15 = (**(code **)(local_a48 + 0xb48))(dVar14,local_578);
          fVar44 = fStack_934;
          auVar9 = local_938;
          pUVar43 = local_a80;
          local_a40._0_4_ = CVar15;
          CVar25 = pUVar23->location + iVar12;
          if (pUVar23->location < 0) {
            CVar25 = ~R;
          }
          local_aa8._M_dataplus._M_p._0_4_ = CVar25;
          local_938 = SUB84(local_a10,0);
          fStack_934 = (float)((ulong)local_a10 >> 0x20);
          if ((int)CVar25 < 0) {
            if (-1 < (int)CVar15) {
              p_Var22 = (_Base_ptr)(local_6f8 + 8);
              p_Var29 = p_Var22;
              for (p_Var32 = local_6e8; p_Var32 != (_Base_ptr)0x0;
                  p_Var32 = (&p_Var32->_M_left)[(int)p_Var32[1]._M_color < (int)CVar15]) {
                if ((int)CVar15 <= (int)p_Var32[1]._M_color) {
                  p_Var29 = p_Var32;
                }
              }
              p_Var32 = p_Var22;
              if ((p_Var29 != p_Var22) &&
                 (p_Var32 = p_Var29, (int)CVar15 < (int)p_Var29[1]._M_color)) {
                p_Var32 = p_Var22;
              }
              __v = (string *)local_a40;
              if (p_Var32 != p_Var22) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_930);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_930,"ERROR: found uniform ",0x15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_930,(char *)local_578,(long)pVStack_570);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_930," in location ",0xd);
                std::ostream::operator<<((ostringstream *)auStack_930,local_a40._0_4_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)auStack_930," which has already been used",0x1c);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_938,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_930);
                std::ios_base::~ios_base(local_8c0);
                goto LAB_01553f68;
              }
LAB_0155404b:
              local_938 = auVar9;
              fStack_934 = fVar44;
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )local_6f8,(int *)__v);
              pUVar23 = local_a50;
              auVar9 = local_938;
              fVar44 = fStack_934;
            }
            fStack_934 = fVar44;
            local_938 = auVar9;
            iVar41 = 0;
            auVar9 = local_938;
            fVar44 = fStack_934;
          }
          else if ((CVar15 != ~R) || (iVar41 = 7, pUVar23->checkLocation != SHADERSTAGE_NONE)) {
            if (CVar15 == CVar25) {
              p_Var22 = (_Base_ptr)(local_6f8 + 8);
              for (p_Var32 = local_6e8; p_Var32 != (_Base_ptr)0x0;
                  p_Var32 = (&p_Var32->_M_left)[(int)p_Var32[1]._M_color < (int)CVar25]) {
                if ((int)CVar25 <= (int)p_Var32[1]._M_color) {
                  p_Var22 = p_Var32;
                }
              }
              p_Var32 = (_Base_ptr)(local_6f8 + 8);
              p_Var29 = p_Var32;
              if ((p_Var22 != p_Var32) &&
                 (p_Var29 = p_Var22, (int)CVar25 < (int)p_Var22[1]._M_color)) {
                p_Var29 = p_Var32;
              }
              __v = &local_aa8;
              if (p_Var29 == p_Var32) goto LAB_0155404b;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_930);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930,"ERROR: expected uniform ",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930,(char *)local_578,(long)pVStack_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930," in location ",0xd);
              std::ostream::operator<<((ostringstream *)auStack_930,local_a40._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930," but it has already been used",0x1d);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_938,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_930);
              std::ios_base::~ios_base(local_8c0);
LAB_01553f68:
              pcVar19 = "Overlapping uniform location";
              pUVar23 = local_a50;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_930);
              pUVar43 = local_a80;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930,"ERROR: found uniform ",0x15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930,(char *)local_578,(long)pVStack_570);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930," in location ",0xd);
              std::ostream::operator<<((ostringstream *)auStack_930,local_a40._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_930," when it should have been in ",0x1d);
              std::ostream::operator<<
                        ((ostringstream *)auStack_930,(ChannelOrder)local_aa8._M_dataplus._M_p);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_938,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_930);
              std::ios_base::~ios_base(local_8c0);
              pcVar19 = "Incorrect uniform location";
            }
            iVar41 = 1;
            tcu::TestContext::setTestResult
                      ((pUVar43->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       pcVar19);
            auVar9 = local_938;
            fVar44 = fStack_934;
          }
          fStack_934 = fVar44;
          local_938 = auVar9;
          if (local_578 != (undefined1  [8])local_568) {
            operator_delete((void *)local_578,
                            (ulong)((long)&((VarType *)local_568[0]._0_8_)->m_type + 1));
          }
          if ((iVar41 != 7) && (iVar41 != 0)) goto LAB_015540d6;
          glu::SubTypeIterator<glu::IsBasicType>::operator++
                    ((SubTypeIterator<glu::IsBasicType> *)local_9d8,
                     (SubTypeIterator<glu::IsBasicType> *)local_3f8,0);
          iVar12 = iVar12 + 1;
          if (uStack_9d0 != (pointer)0x0) {
            operator_delete(uStack_9d0,local_9c8._8_8_ - (long)uStack_9d0);
          }
        }
        iVar41 = 5;
LAB_015540d6:
        if (pVStack_3f0 != (pointer)0x0) {
          operator_delete(pVStack_3f0,local_3e8._8_8_ - (long)pVStack_3f0);
        }
        TVar27.type = (ChannelType)fStack_934;
        TVar27.order = (ChannelOrder)local_938;
        if ((iVar41 != 0) && (iVar41 != 5)) break;
        local_a78 = local_a78 + 1;
        pUVar23 = (local_a20->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar12 = (int)((ulong)((long)(local_a20->
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar23) >>
                      3) * -0x33333333;
        local_a18 = CONCAT71((int7)(int3)((uint)iVar12 >> 8),(long)iVar12 <= (long)local_a78);
        _local_938 = TVar27;
      } while ((long)local_a78 < (long)iVar12);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_6f8);
    pVVar8 = local_9a8;
    pUVar43 = local_a80;
    if ((local_a18 & 1) != 0) {
      (*(code *)local_9a8[0x38])(0,0,0,0x3f800000);
      (*(code *)pVVar8[0x31])(0x4500);
      (*(code *)pVVar8[0x340])
                ((ulong)local_a08 & 0xffffffff,local_a08._4_4_,(ulong)local_a00 & 0xffffffff,
                 local_a00._4_4_);
      iVar12 = (*pUVar43->m_renderCtx->_vptr_RenderContext[3])();
      lVar35 = CONCAT44(extraout_var_02,iVar12);
      local_a18 = CONCAT44(local_a18._4_4_,local_1e0);
      iVar12 = (**(code **)(lVar35 + 0x780))();
      local_6c8 = &DAT_3f8000003f800000;
      uStack_6c0 = 0x3f8000003dcccccd;
      local_6d8 = (_Base_ptr)0xbf8000003f800000;
      sStack_6d0 = 0x3f8000003dcccccd;
      local_6e8 = (_Base_ptr)0x3f800000bf800000;
      p_Stack_6e0 = (_Base_ptr)0x3f8000003dcccccd;
      local_6f8._0_4_ = 0xbf800000;
      local_6f8._4_4_ = 0xbf800000;
      local_6f8._8_4_ = 0x3dcccccd;
      uStack_6ec = 0x3f800000;
      local_728 = 0x2000200010000;
      local_720 = 0x30001;
      local_3c8 = 0;
      uStack_3c0 = 0;
      local_3d8 = 0;
      uStack_3d0 = 0;
      local_3e8.array.elementType = (VarType *)0x0;
      local_3e8._8_8_ = (pointer)0x0;
      local_3f8 = (undefined1  [8])0x0;
      pVStack_3f0 = (pointer)0x0;
      local_998.m_type = (VarType *)0x0;
      local_998.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_9f8._0_8_ = (VarType *)0x0;
      local_9f8._8_4_ = TYPE_INVALID;
      local_9f8._12_4_ = PRECISION_LOWP;
      local_aa8._M_dataplus._M_p = (pointer)0x0;
      local_aa8._M_string_length = 0;
      local_aa8.field_2._M_allocated_capacity = 0;
      if (iVar12 < 0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"posLoc >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
                   ,0x224);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar35 + 0x1680))(local_a18 & 0xffffffff);
      pUVar23 = (local_a20->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((local_a20->
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          )._M_impl.super__Vector_impl_data._M_finish != pUVar23) {
        local_740 = (VarTypeComponent *)(lVar35 + 0x1640);
        local_748 = (VarTypeComponent *)(lVar35 + 0x1660);
        local_750 = (VarTypeComponent *)(lVar35 + 0x1650);
        local_758 = (VarTypeComponent *)(lVar35 + 0x1630);
        local_760 = (VarTypeComponent *)(lVar35 + 0x1610);
        local_768 = (VarTypeComponent *)(lVar35 + 0x1620);
        local_770 = (VarTypeComponent *)(lVar35 + 0x1600);
        local_778 = (VarTypeComponent *)(lVar35 + 0x15f0);
        local_9a8 = (VarTypeComponent *)(lVar35 + 0x15e0);
        local_960 = (undefined8 *)(lVar35 + 0x15b8);
        local_968 = (undefined8 *)(lVar35 + 0x1578);
        local_738 = (undefined8 *)(lVar35 + 0x14e8);
        local_970 = (undefined8 *)(lVar35 + 0x1538);
        local_978 = (undefined8 *)(lVar35 + 0x14f8);
        local_780 = (undefined8 *)(lVar35 + 0x15c8);
        local_788 = (undefined8 *)(lVar35 + 0x1588);
        local_790 = (undefined8 *)(lVar35 + 0x1548);
        local_798 = (undefined8 *)(lVar35 + 0x1508);
        local_7a0 = (undefined8 *)(lVar35 + 0x15a8);
        local_7a8 = (undefined8 *)(lVar35 + 0x1568);
        local_7b0 = (undefined8 *)(lVar35 + 0x1528);
        pUVar33 = (pointer)0x0;
        local_99c = iVar12;
        do {
          local_a10 = pUVar23 + (long)pUVar33;
          local_a78 = (_anonymous_namespace_ *)CONCAT44(local_a78._4_4_,local_a10->location);
          local_a50 = pUVar33;
          glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                    ((SubTypeIterator<glu::IsBasicType> *)local_578,&local_a10->type);
          while( true ) {
            auStack_930._8_8_ = 0;
            auStack_930._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_938 = (undefined1  [4])0x0;
            fStack_934 = 0.0;
            auStack_930._0_4_ = TYPE_INVALID;
            auStack_930._4_4_ = PRECISION_LOWP;
            bVar10 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                               ((SubTypeIterator<glu::IsBasicType> *)local_578,
                                (SubTypeIterator<glu::IsBasicType> *)local_938);
            pvVar7 = (void *)CONCAT44(auStack_930._4_4_,auStack_930._0_4_);
            if (pvVar7 != (void *)0x0) {
              operator_delete(pvVar7,auStack_930._16_8_ - (long)pvVar7);
            }
            iVar12 = local_99c;
            pUVar23 = local_a10;
            if (!bVar10) break;
            glu::
            getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                      ((VarType *)local_ac8,(glu *)local_a10,pVStack_570,
                       (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        )local_568[0]._0_8_,_Var39);
            Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                      ((string *)local_9d8,(_anonymous_namespace_ *)local_a50,(int)pUVar23,
                       (VarType *)&pVStack_570,(TypeComponentVector *)_Var39._M_current);
            iVar12 = (**(code **)(lVar35 + 0xb48))(local_a18 & 0xffffffff,local_9d8);
            DVar11 = glu::getDataTypeScalarType(local_ac8._8_4_);
            pcVar19 = glu::getDataTypeName(DVar11);
            fVar44 = getExpectedValue(DVar11,(uint)local_a78,pcVar19);
            local_a48 = CONCAT44(local_a48._4_4_,fVar44);
            uVar36 = DVar11 - TYPE_SAMPLER_1D;
            if (uVar36 < 0x1e) {
              uVar42 = local_aa8._M_string_length - (long)local_aa8._M_dataplus._M_p;
              iVar41 = (*local_a80->m_renderCtx->_vptr_RenderContext[3])();
              lVar24 = CONCAT44(extraout_var_03,iVar41);
              sizedFormat = 0;
              if (uVar36 < 0x1a) {
                sizedFormat = *(uint *)(&DAT_01ca5250 + (ulong)uVar36 * 4);
              }
              this_00 = (Texture2D *)operator_new(0x70);
              _Var39._M_current = (VarTypeComponent *)0x10;
              glu::Texture2D::Texture2D(this_00,local_a80->m_renderCtx,sizedFormat,0x10,0x10);
              tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
              if (((sizedFormat & 0xffff) == 0x8d8e) || ((sizedFormat & 0xffff) == 0x8d7c)) {
                local_938 = (undefined1  [4])(int)(float)local_a48;
                fStack_934 = 0.0;
                auStack_930._0_4_ = TYPE_INVALID;
                auStack_930._4_4_ = PRECISION_LOWP;
                tcu::clear((this_00->m_refTexture).super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start,(IVec4 *)local_938);
              }
              else {
                local_938 = (undefined1  [4])(float)local_a48;
                fStack_934 = 0.0;
                auStack_930._0_4_ = TYPE_INVALID;
                auStack_930._4_4_ = 0x3f800000;
                tcu::clear((this_00->m_refTexture).super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_938);
              }
              uVar42 = uVar42 >> 3;
              (**(code **)(lVar24 + 8))((int)uVar42 + 0x84c0);
              (*this_00->_vptr_Texture2D[2])(this_00);
              (**(code **)(lVar24 + 0xb8))(0xde1,this_00->m_glTexture);
              (**(code **)(lVar24 + 0x1360))(0xde1,0x2800,0x2600);
              (**(code **)(lVar24 + 0x1360))(0xde1,0x2801,0x2600);
              dVar14 = (**(code **)(lVar24 + 0x800))();
              glu::checkError(dVar14,"UniformLocationCase: texture upload",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
                              ,0x204);
              local_730 = this_00;
              std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
              emplace_back<glu::Texture2D*>
                        ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)&local_aa8,
                         &local_730);
              (**(code **)(lVar35 + 0x14f0))(iVar12,uVar42 & 0xffffffff);
              goto switchD_015546d9_caseD_e;
            }
            if (iVar12 < 0) goto switchD_015546d9_caseD_e;
            local_3f8._0_4_ = fVar44;
            local_998.m_type = (VarType *)CONCAT44(local_998.m_type._4_4_,(int)fVar44);
            local_9f8._0_4_ = (int)(long)fVar44;
            pTVar6 = ((local_a80->super_TestCase).super_TestNode.m_testCtx)->m_log;
            local_938 = SUB84(pTVar6,0);
            fStack_934 = (float)((ulong)pTVar6 >> 0x20);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_930);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_930,"Set uniform ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_930,(char *)local_9d8,(long)uStack_9d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_930," in location ",0xd);
            std::ostream::operator<<((ostringstream *)auStack_930,iVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_930," to ",4);
            std::ostream::_M_insert<double>((double)(float)local_a48);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_938,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_930);
            std::ios_base::~ios_base(local_8c0);
            if (0x25 < local_ac8._8_4_ - TYPE_FLOAT) goto switchD_015546d9_caseD_e;
            pSVar34 = (SubTypeIterator<glu::IsBasicType> *)local_3f8;
            puVar21 = local_738;
            _Var39._M_current = local_9a8;
            switch(local_ac8._8_4_) {
            case 1:
              break;
            case 2:
              puVar21 = local_7b0;
              break;
            case 3:
              puVar21 = local_7a8;
              break;
            case 4:
              puVar21 = local_7a0;
              break;
            case 5:
              goto switchD_015546d9_caseD_5;
            case 6:
              _Var39._M_current = local_778;
              goto switchD_015546d9_caseD_5;
            case 7:
              _Var39._M_current = local_770;
              goto switchD_015546d9_caseD_5;
            case 8:
              _Var39._M_current = local_768;
              goto switchD_015546d9_caseD_5;
            case 9:
              _Var39._M_current = local_760;
              goto switchD_015546d9_caseD_5;
            case 10:
              _Var39._M_current = local_758;
              goto switchD_015546d9_caseD_5;
            case 0xb:
              _Var39._M_current = local_750;
              goto switchD_015546d9_caseD_5;
            case 0xc:
              _Var39._M_current = local_748;
              goto switchD_015546d9_caseD_5;
            case 0xd:
              _Var39._M_current = local_740;
switchD_015546d9_caseD_5:
              (*(code *)*_Var39._M_current)(iVar12,1,0,local_3f8);
            default:
              goto switchD_015546d9_caseD_e;
            case 0x1b:
            case 0x23:
              pSVar34 = &local_998;
              puVar21 = local_978;
              break;
            case 0x1c:
            case 0x24:
              pSVar34 = &local_998;
              puVar21 = local_970;
              break;
            case 0x1d:
            case 0x25:
              pSVar34 = &local_998;
              puVar21 = local_968;
              break;
            case 0x1e:
            case 0x26:
              pSVar34 = &local_998;
              puVar21 = local_960;
              break;
            case 0x1f:
              puVar21 = local_798;
              goto LAB_015548bb;
            case 0x20:
              puVar21 = local_790;
              goto LAB_015548bb;
            case 0x21:
              puVar21 = local_788;
              goto LAB_015548bb;
            case 0x22:
              puVar21 = local_780;
LAB_015548bb:
              pSVar34 = (SubTypeIterator<glu::IsBasicType> *)local_9f8;
            }
            (*(code *)*puVar21)(iVar12,1,pSVar34);
switchD_015546d9_caseD_e:
            if (local_9d8 != (undefined1  [8])local_9c8) {
              operator_delete((void *)local_9d8,(ulong)(local_9c8._0_8_ + 1));
            }
            glu::VarType::~VarType((VarType *)local_ac8);
            glu::SubTypeIterator<glu::IsBasicType>::operator++
                      ((SubTypeIterator<glu::IsBasicType> *)local_a40,
                       (SubTypeIterator<glu::IsBasicType> *)local_578,0);
            local_a78 = (_anonymous_namespace_ *)
                        CONCAT44(local_a78._4_4_,(uint)local_a78 - ((int)~(uint)local_a78 >> 0x1f));
            if (local_a38 != (TextureFormat)0x0) {
              operator_delete((void *)local_a38,local_a30._8_8_ - (long)local_a38);
            }
          }
          if (pVStack_570 != (VarType *)0x0) {
            operator_delete(pVStack_570,local_568[0]._8_8_ - (long)pVStack_570);
          }
          pUVar33 = (pointer)(ulong)((int)local_a50 + 1);
          pUVar23 = (local_a20->
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pUVar30 = (pointer)(((long)(local_a20->
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar23 >>
                              3) * -0x3333333333333333);
        } while (pUVar33 <= pUVar30 && (long)pUVar30 - (long)pUVar33 != 0);
      }
      (**(code **)(lVar35 + 0x610))(iVar12);
      (**(code **)(lVar35 + 0x19f0))(iVar12,4,0x1406,0,0,local_6f8);
      (**(code **)(lVar35 + 0x568))(4,6,0x1403,&local_728);
      (**(code **)(lVar35 + 0x518))(iVar12);
      pUVar43 = local_a80;
      if (0 < (int)(local_aa8._M_string_length - (long)local_aa8._M_dataplus._M_p >> 3)) {
        lVar35 = 0;
        do {
          if (*(long **)(local_aa8._M_dataplus._M_p + lVar35 * 8) != (long *)0x0) {
            (**(code **)(**(long **)(local_aa8._M_dataplus._M_p + lVar35 * 8) + 8))();
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 < (int)(local_aa8._M_string_length - (long)local_aa8._M_dataplus._M_p >> 3))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_aa8._M_dataplus._M_p,
                        local_aa8.field_2._M_allocated_capacity - (long)local_aa8._M_dataplus._M_p);
      }
      context = pUVar43->m_renderCtx;
      iVar12 = (int)local_a08;
      iVar41 = local_a08._4_4_;
      local_6f8._0_4_ = RGBA;
      local_6f8._4_4_ = UNORM_INT8;
      pTVar40 = (TypeComponentVector *)local_a70._16_8_;
      if ((TypeComponentVector *)local_a70._16_8_ != (TypeComponentVector *)0x0) {
        pTVar40 = (TypeComponentVector *)local_a70._8_8_;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_938,(TextureFormat *)local_6f8,local_a70._0_4_,
                 local_a70._4_4_,1,pTVar40);
      glu::readPixels(context,iVar12,iVar41,(PixelBufferAccess *)local_938);
      local_6f8._0_4_ = RGBA;
      local_6f8._4_4_ = UNORM_INT8;
      if ((TypeComponentVector *)local_a70._16_8_ != (TypeComponentVector *)0x0) {
        local_a70._16_8_ = local_a70._8_8_;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_938,(TextureFormat *)local_6f8,local_a70._0_4_,
                 local_a70._4_4_,1,(void *)local_a70._16_8_);
      local_6f8._0_4_ = 0x3dcccccd;
      local_6f8._4_4_ = 0x3dcccccd;
      stack0xfffffffffffff910 = 0x3dcccccd3dcccccd;
      local_3f8 = (undefined1  [8])&DAT_3f8000003f800000;
      pVStack_3f0 = (pointer)&DAT_3f8000003f800000;
      bVar10 = (int)auStack_930._4_4_ < 1;
      if (0 < (int)auStack_930._4_4_) {
        bVar10 = false;
        iVar12 = 0;
        do {
          if (0 < (int)auStack_930._0_4_) {
            iVar41 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_a40,(int)local_938,iVar41,iVar12);
              local_9d8 = (undefined1  [8])0x0;
              uStack_9d0 = (pointer)0x0;
              lVar35 = 0;
              do {
                *(float *)(local_9d8 + lVar35 * 4) =
                     *(float *)(local_a40 + lVar35 * 4) - *(float *)(local_3f8 + lVar35 * 4);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 4);
              local_578 = (undefined1  [8])0x0;
              pVStack_570 = (VarType *)0x0;
              lVar35 = 0;
              do {
                fVar44 = *(float *)(local_9d8 + lVar35 * 4);
                fVar45 = -fVar44;
                if (-fVar44 <= fVar44) {
                  fVar45 = fVar44;
                }
                *(float *)(local_578 + lVar35 * 4) = fVar45;
                lVar35 = lVar35 + 1;
              } while (lVar35 != 4);
              local_9d8 = (undefined1  [8])((ulong)local_9d8 & 0xffffffff00000000);
              lVar35 = 0;
              do {
                local_9d8[lVar35] =
                     *(float *)(local_578 + lVar35 * 4) <= *(float *)(local_6f8 + lVar35 * 4);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 4);
              if (local_9d8[0] ==
                  (_Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
                   )0x0) goto LAB_01554c49;
              uVar42 = 0xffffffffffffffff;
              do {
                if (uVar42 == 2) {
                  uVar31 = 3;
                  break;
                }
                uVar31 = uVar42 + 1;
                lVar35 = uVar42 + 2;
                uVar42 = uVar31;
              } while (local_9d8[lVar35] != '\0');
              if (uVar31 < 3) goto LAB_01554c49;
              iVar41 = iVar41 + 1;
            } while (iVar41 < (int)auStack_930._0_4_);
          }
          iVar12 = iVar12 + 1;
          bVar10 = (int)auStack_930._4_4_ <= iVar12;
        } while (iVar12 < (int)auStack_930._4_4_);
      }
LAB_01554c49:
      pcVar19 = "Shader produced incorrect result";
      if (bVar10) {
        pcVar19 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_a80->super_TestCase).super_TestNode.m_testCtx,(uint)(byte)~bVar10,pcVar19);
    }
  }
  tcu::Surface::~Surface((Surface *)local_a70);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar35 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar35));
    lVar35 = lVar35 + -0x18;
  } while (lVar35 != -0x18);
  return extraout_EAX;
}

Assistant:

UniformLocationCase::IterateResult UniformLocationCase::run (const vector<UniformInfo>& uniformList)
{
	using gls::TextureTestUtil::RandomViewport;

	const glu::ProgramSources	sources		= genShaderSources(uniformList);
	const glu::ShaderProgram	program		(m_renderCtx, sources);
	const int					baseSeed	= m_testCtx.getCommandLine().getBaseSeed();
	const glw::Functions&		gl			= m_renderCtx.getFunctions();
	const RandomViewport		viewport	(m_renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()) + baseSeed);

	tcu::Surface				rendered	(RENDER_SIZE, RENDER_SIZE);

	if (!verifyLocations(program, uniformList))
		return STOP;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	render(program, uniformList);

	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	if (!verifyResult(rendered.getAccess()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader produced incorrect result");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}